

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void __thiscall l2r_l2_svc_fun::Xv(l2r_l2_svc_fun *this,double *v,double *Xv)

{
  feature_node **ppfVar1;
  feature_node *pfVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  
  lVar3 = (long)this->prob->l;
  if (0 < lVar3) {
    ppfVar1 = this->prob->x;
    lVar4 = 0;
    do {
      pfVar2 = ppfVar1[lVar4];
      Xv[lVar4] = 0.0;
      iVar5 = pfVar2->index;
      if (iVar5 != -1) {
        dVar6 = Xv[lVar4];
        do {
          dVar6 = dVar6 + v[(long)iVar5 + -1] * pfVar2->value;
          Xv[lVar4] = dVar6;
          iVar5 = pfVar2[1].index;
          pfVar2 = pfVar2 + 1;
        } while (iVar5 != -1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar3);
  }
  return;
}

Assistant:

void l2r_l2_svc_fun::Xv(double *v, double *Xv)
{
	int i;
	int l=prob->l;
	feature_node **x=prob->x;

#ifdef ENABLED_OPENMP
#pragma omp parallel for private(i) schedule(guided)
#endif
	for(i=0;i<l;i++)
	{
		feature_node *s=x[i];
		Xv[i]=0;
		while(s->index!=-1)
		{
			Xv[i]+=v[s->index-1]*s->value;
			s++;
		}
	}
}